

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O1

int __thiscall Fl_Browser::item_width(Fl_Browser *this,void *item)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  Fl_Browser *pFVar5;
  char *pcVar6;
  byte *pbVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  byte *pbVar12;
  ulong uVar13;
  double dVar14;
  byte *local_48;
  void *local_40;
  Fl_Browser *local_38;
  
  local_48 = (byte *)((long)item + 0x23);
  piVar9 = this->column_widths_;
  cVar1 = this->column_char_;
  iVar10 = 0;
  pbVar7 = local_48;
  local_40 = item;
  local_38 = this;
  do {
    pbVar12 = pbVar7;
    iVar11 = *piVar9;
    if (iVar11 == 0) break;
    pcVar6 = strchr((char *)pbVar12,(int)cVar1);
    if (pcVar6 == (char *)0x0) {
      iVar11 = 0;
    }
    iVar10 = iVar10 + iVar11;
    piVar9 = piVar9 + 1;
    pbVar7 = (byte *)(pcVar6 + 1);
  } while (pcVar6 != (char *)0x0);
  pFVar5 = local_38;
  uVar13 = (ulong)(uint)(local_38->super_Fl_Browser_).textfont_;
  uVar8 = (ulong)(uint)(local_38->super_Fl_Browser_).textsize_;
  local_48 = pbVar12;
  do {
    bVar2 = pFVar5->format_char_;
    if (((*local_48 != bVar2) || (bVar3 = local_48[1], bVar3 == 0)) || (bVar3 == bVar2)) break;
    pbVar7 = local_48 + 2;
    bVar4 = true;
    if (bVar3 < 0x53) {
      switch(bVar3) {
      case 0x40:
        local_48 = local_48 + 1;
LAB_001a6500:
        bVar4 = false;
        pbVar7 = local_48;
        break;
      case 0x41:
      case 0x44:
      case 0x45:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
        break;
      case 0x42:
      case 0x43:
        pbVar7 = local_48 + 1;
        do {
          pbVar12 = pbVar7 + 1;
          pbVar7 = pbVar7 + 1;
        } while (*pbVar12 - 0x30 < 10);
        break;
      case 0x46:
        local_48 = pbVar7;
        uVar13 = strtol((char *)pbVar7,(char **)&local_48,10);
        pbVar7 = local_48;
        break;
      case 0x4c:
        goto switchD_001a6472_caseD_6c;
      case 0x4d:
        goto switchD_001a6472_caseD_6d;
      default:
        local_48 = pbVar7;
        if (bVar3 == 0x2e) goto LAB_001a6500;
      }
    }
    else {
      switch(bVar3) {
      case 0x66:
      case 0x74:
        uVar13 = 4;
        break;
      case 0x67:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
        break;
      case 0x69:
        uVar13 = (ulong)((uint)uVar13 | 2);
        break;
      case 0x6c:
switchD_001a6472_caseD_6c:
        uVar8 = 0x18;
        break;
      case 0x6d:
switchD_001a6472_caseD_6d:
        uVar8 = 0x12;
        break;
      case 0x73:
        uVar8 = 0xb;
        break;
      default:
        if (bVar3 == 0x53) {
          local_48 = pbVar7;
          uVar8 = strtol((char *)pbVar7,(char **)&local_48,10);
          pbVar7 = local_48;
        }
        else if (bVar3 == 0x62) {
          uVar13 = (ulong)((uint)uVar13 | 1);
        }
      }
    }
    local_48 = pbVar7;
  } while (bVar4);
  if ((*local_48 == pFVar5->format_char_) && (local_48[1] != 0)) {
    local_48 = local_48 + 1;
  }
  if (iVar10 == 0) {
    if (*(long *)((long)local_40 + 0x18) == 0) {
      iVar10 = 0;
    }
    else {
      iVar10 = *(int *)(*(long *)((long)local_40 + 0x18) + 8);
    }
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,uVar13 & 0xffffffff,uVar8 & 0xffffffff);
  dVar14 = fl_width((char *)local_48);
  return (int)dVar14 + iVar10 + 6;
}

Assistant:

int Fl_Browser::item_width(void *item) const {
  FL_BLINE* l=(FL_BLINE*)item;
  char* str = l->txt;
  const int* i = column_widths();
  int ww = 0;

  while (*i) { // add up all tab-separated fields
    char* e;
    e = strchr(str, column_char());
    if (!e) break; // last one occupied by text
    str = e+1;
    ww += *i++;
  }

  // OK, we gotta parse the string and find the string width...
  int tsize = textsize();
  Fl_Font font = textfont();
  int done = 0;

  while (*str == format_char_ && str[1] && str[1] != format_char_) {
    str ++;
    switch (*str++) {
    case 'l': case 'L': tsize = 24; break;
    case 'm': case 'M': tsize = 18; break;
    case 's': tsize = 11; break;
    case 'b': font = (Fl_Font)(font|FL_BOLD); break;
    case 'i': font = (Fl_Font)(font|FL_ITALIC); break;
    case 'f': case 't': font = FL_COURIER; break;
    case 'B':
    case 'C': while (isdigit(*str & 255)) str++; break; // skip a color number
    case 'F': font = (Fl_Font)strtol(str, &str, 10); break;
    case 'S': tsize = strtol(str, &str, 10); break;
    case '.':
      done = 1;
      break;
    case '@':
      str--;
      done = 1;
    }

    if (done)
      break;
  }

  if (*str == format_char_ && str[1])
    str ++;

  if (ww==0 && l->icon) ww = l->icon->w();

  fl_font(font, tsize);
  return ww + int(fl_width(str)) + 6;
}